

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O2

void __thiscall
QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_>::insert
          (QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *this,
          QMap<QByteArray,_QFlags<QtMocConstants::EnumFlags>_> *map)

{
  QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
  *pQVar1;
  long in_FS_OFFSET;
  Map copy;
  _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
  local_58;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (map->d).d.ptr;
  if ((pQVar1 != (QMapData<std::map<QByteArray,_QFlags<QtMocConstants::EnumFlags>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    detach(this);
    local_58._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_58._M_impl.super__Rb_tree_header._M_node_count = 0xaaaaaaaaaaaaaaaa;
    local_58._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_58._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0xaaaaaaaaaaaaaaaa;
    local_58._M_impl._0_8_ = 0xaaaaaaaaaaaaaaaa;
    local_58._M_impl.super__Rb_tree_header._M_header._M_color = 0xaaaaaaaa;
    local_58._M_impl.super__Rb_tree_header._M_header._4_4_ = 0xaaaaaaaa;
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
    ::_Rb_tree(&local_58,&(((map->d).d.ptr)->m)._M_t);
    std::
    _Rb_tree<QByteArray,std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>,std::_Select1st<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>>
    ::_M_merge_unique<std::less<QByteArray>>
              ((_Rb_tree<QByteArray,std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>,std::_Select1st<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>,std::less<QByteArray>,std::allocator<std::pair<QByteArray_const,QFlags<QtMocConstants::EnumFlags>>>>
                *)&local_58,&(((this->d).d.ptr)->m)._M_t);
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
    ::_M_move_assign(&(((this->d).d.ptr)->m)._M_t,&local_58);
    std::
    _Rb_tree<QByteArray,_std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>,_std::_Select1st<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>,_std::less<QByteArray>,_std::allocator<std::pair<const_QByteArray,_QFlags<QtMocConstants::EnumFlags>_>_>_>
    ::~_Rb_tree(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void insert(const QMap<Key, T> &map)
    {
        // TODO: improve. In case of assignment, why copying first?
        if (map.isEmpty())
            return;

        detach();

#ifdef __cpp_lib_node_extract
        auto copy = map.d->m;
        copy.merge(std::move(d->m));
        d->m = std::move(copy);
#else
        // this is a std::copy, but we can't use std::inserter (need insert_or_assign...).
        // copy in reverse order, trying to make effective use of insertionHint.
        auto insertionHint = d->m.end();
        auto mapIt = map.d->m.crbegin();
        auto end = map.d->m.crend();
        for (; mapIt != end; ++mapIt)
            insertionHint = d->m.insert_or_assign(insertionHint, mapIt->first, mapIt->second);
#endif
    }